

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::TraceStats_BufferStats::ParseFromArray
          (TraceStats_BufferStats *this,void *raw,size_t size)

{
  uint64_t uVar1;
  undefined1 uVar2;
  uint uVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint64_t *puVar6;
  uint64_t uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t *end;
  ulong uVar10;
  uint64_t preamble;
  uint32_t local_60;
  ushort local_5c;
  uint8_t local_5a;
  uint64_t int_value;
  uint64_t payload_length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  bitset<20UL> *local_40;
  uint64_t payload_length_1;
  
  local_48 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar9 = 0;
  do {
    if (end <= raw) goto switchD_002b083b_caseD_3;
    preamble = 0;
    if ((long)(char)*raw < 0) {
      puVar6 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
      if (puVar6 != (uint64_t *)raw) goto LAB_002b0803;
LAB_002b0ca0:
      uVar9 = 0;
      uVar7 = 0;
      goto LAB_002b0935;
    }
    puVar6 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_002b0803:
    uVar1 = preamble;
    uVar10 = preamble >> 3;
    uVar3 = (uint)uVar10;
    if ((uVar3 == 0) || (end <= puVar6)) goto LAB_002b0ca0;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar5 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar6,(uint8_t *)end,&int_value);
      uVar8 = 0;
      uVar7 = 0;
      if (puVar5 == puVar6) goto LAB_002b0935;
      break;
    case 1:
      puVar5 = puVar6 + 1;
      if (end < puVar5) goto switchD_002b083b_caseD_3;
      int_value = *puVar6;
LAB_002b0887:
      uVar8 = 0;
      break;
    case 2:
      puVar4 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar6,(uint8_t *)end,&payload_length)
      ;
      if ((puVar4 == puVar6) || ((ulong)((long)end - (long)puVar4) < payload_length))
      goto switchD_002b083b_caseD_3;
      puVar5 = (uint64_t *)((long)puVar4 + payload_length);
      uVar8 = payload_length;
      int_value = (uint64_t)puVar4;
      break;
    default:
      goto switchD_002b083b_caseD_3;
    case 5:
      puVar5 = (uint64_t *)((long)puVar6 + 4);
      if (puVar5 <= end) {
        int_value = (uint64_t)(uint)*puVar6;
        goto LAB_002b0887;
      }
      goto switchD_002b083b_caseD_3;
    }
    raw = puVar5;
  } while ((0xffff < uVar3) || (0xfffffff < uVar8));
  uVar9 = uVar8 | (uVar1 & 7) << 0x30 | uVar10 << 0x20;
  uVar7 = int_value;
LAB_002b0935:
  local_40 = &this->_has_field_;
LAB_002b094d:
  do {
    preamble = uVar7;
    local_60 = (uint32_t)uVar9;
    local_5a = (uint8_t)(uVar9 >> 0x30);
    uVar3 = (uint)(uVar9 >> 0x20);
    local_5c = (ushort)(uVar9 >> 0x20);
    if (local_5c == 0) {
      return end == (uint64_t *)raw;
    }
    if (local_5c < 0x14) {
      std::bitset<20UL>::set(local_40,(ulong)(uVar3 & 0x1f),true);
      uVar3 = (uint)local_5c;
    }
    uVar3 = (uVar3 & 0xffff) - 1;
    if (uVar3 < 0x13) {
      uVar2 = (*(code *)(&DAT_0037965c + *(int *)(&DAT_0037965c + (ulong)uVar3 * 4)))();
      return (bool)uVar2;
    }
    protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
              ((Field *)&preamble,local_48);
    do {
      if (end <= raw) {
LAB_002b0c7d:
        uVar9 = 0;
        uVar7 = 0;
        goto LAB_002b094d;
      }
      int_value = 0;
      if ((long)(char)*raw < 0) {
        puVar6 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
        if (puVar6 == (uint64_t *)raw) goto LAB_002b0c7d;
      }
      else {
        puVar6 = (uint64_t *)((long)raw + 1);
        int_value = (long)(char)*raw;
      }
      uVar1 = int_value;
      uVar10 = int_value >> 3;
      uVar3 = (uint)uVar10;
      if ((uVar3 == 0) || (end <= puVar6)) goto LAB_002b0c7d;
      payload_length = 0;
      switch((uint)int_value & 7) {
      case 0:
        puVar5 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar6,(uint8_t *)end,&payload_length);
        uVar8 = 0;
        uVar9 = 0;
        uVar7 = 0;
        if (puVar5 == puVar6) goto LAB_002b094d;
        break;
      case 1:
        puVar5 = puVar6 + 1;
        if (end < puVar5) goto switchD_002b0b85_caseD_3;
        payload_length = *puVar6;
LAB_002b0bdc:
        uVar8 = 0;
        break;
      case 2:
        puVar4 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar6,(uint8_t *)end,&payload_length_1);
        if ((puVar4 == puVar6) || ((ulong)((long)end - (long)puVar4) < payload_length_1))
        goto switchD_002b0b85_caseD_3;
        puVar5 = (uint64_t *)((long)puVar4 + payload_length_1);
        uVar8 = payload_length_1;
        payload_length = (uint64_t)puVar4;
        break;
      default:
        goto switchD_002b0b85_caseD_3;
      case 5:
        puVar5 = (uint64_t *)((long)puVar6 + 4);
        if (puVar5 <= end) {
          payload_length = (uint64_t)(uint)*puVar6;
          goto LAB_002b0bdc;
        }
        goto switchD_002b0b85_caseD_3;
      }
      raw = puVar5;
    } while ((0xffff < uVar3) || (0xfffffff < uVar8));
    uVar9 = uVar8 | (uVar1 & 7) << 0x30 | uVar10 << 0x20;
    uVar7 = payload_length;
  } while( true );
switchD_002b083b_caseD_3:
  uVar9 = 0;
  uVar7 = 0;
  goto LAB_002b0935;
switchD_002b0b85_caseD_3:
  uVar9 = 0;
  uVar7 = 0;
  goto LAB_002b094d;
}

Assistant:

bool TraceStats_BufferStats::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 12 /* buffer_size */:
        field.get(&buffer_size_);
        break;
      case 1 /* bytes_written */:
        field.get(&bytes_written_);
        break;
      case 13 /* bytes_overwritten */:
        field.get(&bytes_overwritten_);
        break;
      case 14 /* bytes_read */:
        field.get(&bytes_read_);
        break;
      case 15 /* padding_bytes_written */:
        field.get(&padding_bytes_written_);
        break;
      case 16 /* padding_bytes_cleared */:
        field.get(&padding_bytes_cleared_);
        break;
      case 2 /* chunks_written */:
        field.get(&chunks_written_);
        break;
      case 10 /* chunks_rewritten */:
        field.get(&chunks_rewritten_);
        break;
      case 3 /* chunks_overwritten */:
        field.get(&chunks_overwritten_);
        break;
      case 18 /* chunks_discarded */:
        field.get(&chunks_discarded_);
        break;
      case 17 /* chunks_read */:
        field.get(&chunks_read_);
        break;
      case 11 /* chunks_committed_out_of_order */:
        field.get(&chunks_committed_out_of_order_);
        break;
      case 4 /* write_wrap_count */:
        field.get(&write_wrap_count_);
        break;
      case 5 /* patches_succeeded */:
        field.get(&patches_succeeded_);
        break;
      case 6 /* patches_failed */:
        field.get(&patches_failed_);
        break;
      case 7 /* readaheads_succeeded */:
        field.get(&readaheads_succeeded_);
        break;
      case 8 /* readaheads_failed */:
        field.get(&readaheads_failed_);
        break;
      case 9 /* abi_violations */:
        field.get(&abi_violations_);
        break;
      case 19 /* trace_writer_packet_loss */:
        field.get(&trace_writer_packet_loss_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}